

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

void getPixelColorsRGBA8(uchar *buffer,size_t numpixels,uint has_alpha,uchar *in,
                        LodePNGColorMode *mode)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  ulong uVar6;
  uchar uVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  uchar *puVar11;
  byte *pbVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  
  uVar5 = 4 - (has_alpha == 0);
  switch(mode->colortype) {
  case LCT_GREY:
    uVar13 = mode->bitdepth;
    if (uVar13 == 8) {
      if (numpixels != 0) {
        puVar11 = buffer + 3;
        sVar8 = 0;
        do {
          uVar7 = in[sVar8];
          puVar11[-1] = uVar7;
          puVar11[-2] = uVar7;
          puVar11[-3] = uVar7;
          if (has_alpha != 0) {
            if (mode->key_defined == 0) {
              uVar7 = 0xff;
            }
            else {
              uVar7 = -(mode->key_r != (uint)in[sVar8]);
            }
            *puVar11 = uVar7;
          }
          sVar8 = sVar8 + 1;
          puVar11 = puVar11 + uVar5;
        } while (numpixels != sVar8);
      }
    }
    else if (uVar13 == 0x10) {
      if (numpixels != 0) {
        puVar11 = buffer + 3;
        sVar8 = 0;
        do {
          uVar7 = in[sVar8 * 2];
          puVar11[-1] = uVar7;
          puVar11[-2] = uVar7;
          puVar11[-3] = uVar7;
          if (has_alpha != 0) {
            if (mode->key_defined == 0) {
              uVar7 = 0xff;
            }
            else {
              uVar7 = -((uint)(ushort)(*(ushort *)(in + sVar8 * 2) << 8 |
                                      *(ushort *)(in + sVar8 * 2) >> 8) != mode->key_r);
            }
            *puVar11 = uVar7;
          }
          sVar8 = sVar8 + 1;
          puVar11 = puVar11 + uVar5;
        } while (numpixels != sVar8);
      }
    }
    else if (numpixels != 0) {
      sVar8 = 0;
      uVar9 = 0;
      do {
        uVar6 = (ulong)mode->bitdepth;
        uVar16 = 0;
        uVar10 = uVar6;
        uVar15 = uVar9;
        if (uVar6 != 0) {
          do {
            uVar16 = (uint)((in[uVar15 >> 3] >> (~(byte)uVar15 & 7) & 1) != 0) + uVar16 * 2;
            uVar10 = uVar10 - 1;
            uVar15 = uVar15 + 1;
          } while (uVar10 != 0);
          uVar9 = uVar9 + uVar6;
        }
        uVar7 = (uchar)((uVar16 * 0xff) / (uint)~(-1 << ((byte)uVar13 & 0x1f)));
        buffer[2] = uVar7;
        buffer[1] = uVar7;
        *buffer = uVar7;
        if (has_alpha != 0) {
          if (mode->key_defined == 0) {
            uVar7 = 0xff;
          }
          else {
            uVar7 = -(uVar16 != mode->key_r);
          }
          buffer[3] = uVar7;
        }
        sVar8 = sVar8 + 1;
        buffer = buffer + uVar5;
      } while (sVar8 != numpixels);
    }
    break;
  case LCT_RGB:
    if (mode->bitdepth == 8) {
      if (numpixels != 0) {
        puVar11 = buffer + 3;
        pbVar12 = in + 2;
        do {
          bVar1 = pbVar12[-2];
          puVar11[-3] = bVar1;
          bVar2 = pbVar12[-1];
          puVar11[-2] = bVar2;
          bVar3 = *pbVar12;
          puVar11[-1] = bVar3;
          if (has_alpha != 0) {
            uVar7 = 0xff;
            if (((mode->key_defined != 0) && (mode->key_r == (uint)bVar1)) &&
               (mode->key_g == (uint)bVar2)) {
              uVar7 = -(mode->key_b != (uint)bVar3);
            }
            *puVar11 = uVar7;
          }
          puVar11 = puVar11 + uVar5;
          pbVar12 = pbVar12 + 3;
          numpixels = numpixels - 1;
        } while (numpixels != 0);
      }
    }
    else if (numpixels != 0) {
      puVar11 = buffer + 3;
      do {
        puVar11[-3] = (uchar)*(ushort *)in;
        puVar11[-2] = (uchar)*(ushort *)((long)in + 2);
        uVar4 = *(ushort *)((long)in + 4);
        puVar11[-1] = (uchar)uVar4;
        if (has_alpha != 0) {
          uVar7 = 0xff;
          if (((mode->key_defined != 0) &&
              ((uint)(ushort)(*(ushort *)in << 8 | *(ushort *)in >> 8) == mode->key_r)) &&
             ((uint)(ushort)(*(ushort *)((long)in + 2) << 8 | *(ushort *)((long)in + 2) >> 8) ==
              mode->key_g)) {
            uVar7 = -((uint)CONCAT11((uchar)uVar4,*(undefined1 *)((long)in + 5)) != mode->key_b);
          }
          *puVar11 = uVar7;
        }
        puVar11 = puVar11 + uVar5;
        in = (uchar *)((long)in + 6);
        numpixels = numpixels - 1;
      } while (numpixels != 0);
    }
    break;
  case LCT_PALETTE:
    if (numpixels != 0) {
      sVar8 = 0;
      uVar9 = 0;
      do {
        uVar10 = (ulong)mode->bitdepth;
        if (uVar10 == 8) {
          uVar14 = (ulong)in[sVar8];
        }
        else {
          uVar14 = 0;
          uVar15 = uVar10;
          uVar6 = uVar9;
          if (uVar10 != 0) {
            do {
              uVar14 = (ulong)((uint)((in[uVar6 >> 3] >> (~(byte)uVar6 & 7) & 1) != 0) +
                              (int)uVar14 * 2);
              uVar15 = uVar15 - 1;
              uVar6 = uVar6 + 1;
            } while (uVar15 != 0);
            uVar9 = uVar9 + uVar10;
          }
        }
        if (uVar14 < mode->palettesize) {
          uVar13 = (int)uVar14 << 2;
          *buffer = mode->palette[uVar13];
          buffer[1] = mode->palette[(ulong)uVar13 + 1];
          buffer[2] = mode->palette[(ulong)uVar13 + 2];
          if (has_alpha != 0) {
            uVar7 = mode->palette[(ulong)uVar13 + 3];
LAB_0010fc13:
            buffer[3] = uVar7;
          }
        }
        else {
          buffer[2] = '\0';
          buffer[0] = '\0';
          buffer[1] = '\0';
          uVar7 = 0xff;
          if (has_alpha != 0) goto LAB_0010fc13;
        }
        sVar8 = sVar8 + 1;
        buffer = buffer + uVar5;
      } while (sVar8 != numpixels);
    }
    break;
  case LCT_GREY_ALPHA:
    if (mode->bitdepth == 8) {
      if (numpixels != 0) {
        puVar11 = buffer + 3;
        sVar8 = 0;
        do {
          uVar7 = in[sVar8 * 2];
          puVar11[-1] = uVar7;
          puVar11[-2] = uVar7;
          puVar11[-3] = uVar7;
          if (has_alpha != 0) {
            *puVar11 = in[sVar8 * 2 + 1];
          }
          sVar8 = sVar8 + 1;
          puVar11 = puVar11 + uVar5;
        } while (numpixels != sVar8);
      }
    }
    else if (numpixels != 0) {
      puVar11 = buffer + 3;
      sVar8 = 0;
      do {
        uVar7 = in[sVar8 * 4];
        puVar11[-1] = uVar7;
        puVar11[-2] = uVar7;
        puVar11[-3] = uVar7;
        if (has_alpha != 0) {
          *puVar11 = in[sVar8 * 4 + 2];
        }
        sVar8 = sVar8 + 1;
        puVar11 = puVar11 + uVar5;
      } while (numpixels != sVar8);
    }
    break;
  case LCT_RGBA:
    if (mode->bitdepth == 8) {
      if (numpixels != 0) {
        puVar11 = buffer + 3;
        sVar8 = 0;
        do {
          puVar11[-3] = in[sVar8 * 4];
          puVar11[-2] = in[sVar8 * 4 + 1];
          puVar11[-1] = in[sVar8 * 4 + 2];
          if (has_alpha != 0) {
            *puVar11 = in[sVar8 * 4 + 3];
          }
          sVar8 = sVar8 + 1;
          puVar11 = puVar11 + uVar5;
        } while (numpixels != sVar8);
      }
    }
    else if (numpixels != 0) {
      puVar11 = buffer + 3;
      sVar8 = 0;
      do {
        puVar11[-3] = in[sVar8 * 8];
        puVar11[-2] = in[sVar8 * 8 + 2];
        puVar11[-1] = in[sVar8 * 8 + 4];
        if (has_alpha != 0) {
          *puVar11 = in[sVar8 * 8 + 6];
        }
        sVar8 = sVar8 + 1;
        puVar11 = puVar11 + uVar5;
      } while (numpixels != sVar8);
    }
  }
  return;
}

Assistant:

static void getPixelColorsRGBA8(unsigned char* buffer, size_t numpixels,
	unsigned has_alpha, const unsigned char* in,
	const LodePNGColorMode* mode)
{
	unsigned num_channels = has_alpha ? 4 : 3;
	size_t i;
	if (mode->colortype == LCT_GREY)
	{
		if (mode->bitdepth == 8)
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = buffer[1] = buffer[2] = in[i];
				if (has_alpha) buffer[3] = mode->key_defined && in[i] == mode->key_r ? 0 : 255;
			}
		}
		else if (mode->bitdepth == 16)
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = buffer[1] = buffer[2] = in[i * 2];
				if (has_alpha) buffer[3] = mode->key_defined && 256U * in[i * 2 + 0] + in[i * 2 + 1] == mode->key_r ? 0 : 255;
			}
		}
		else
		{
			unsigned highest = ((1U << mode->bitdepth) - 1U); /*highest possible value for this bit depth*/
			size_t j = 0;
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				unsigned value = readBitsFromReversedStream(&j, in, mode->bitdepth);
				buffer[0] = buffer[1] = buffer[2] = (value * 255) / highest;
				if (has_alpha) buffer[3] = mode->key_defined && value == mode->key_r ? 0 : 255;
			}
		}
	}
	else if (mode->colortype == LCT_RGB)
	{
		if (mode->bitdepth == 8)
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = in[i * 3 + 0];
				buffer[1] = in[i * 3 + 1];
				buffer[2] = in[i * 3 + 2];
				if (has_alpha) buffer[3] = mode->key_defined && buffer[0] == mode->key_r
					&& buffer[1] == mode->key_g && buffer[2] == mode->key_b ? 0 : 255;
			}
		}
		else
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = in[i * 6 + 0];
				buffer[1] = in[i * 6 + 2];
				buffer[2] = in[i * 6 + 4];
				if (has_alpha) buffer[3] = mode->key_defined
					&& 256U * in[i * 6 + 0] + in[i * 6 + 1] == mode->key_r
					&& 256U * in[i * 6 + 2] + in[i * 6 + 3] == mode->key_g
					&& 256U * in[i * 6 + 4] + in[i * 6 + 5] == mode->key_b ? 0 : 255;
			}
		}
	}
	else if (mode->colortype == LCT_PALETTE)
	{
		unsigned index;
		size_t j = 0;
		for (i = 0; i != numpixels; ++i, buffer += num_channels)
		{
			if (mode->bitdepth == 8) index = in[i];
			else index = readBitsFromReversedStream(&j, in, mode->bitdepth);

			if (index >= mode->palettesize)
			{
				/*This is an error according to the PNG spec, but most PNG decoders make it black instead.
				Done here too, slightly faster due to no error handling needed.*/
				buffer[0] = buffer[1] = buffer[2] = 0;
				if (has_alpha) buffer[3] = 255;
			}
			else
			{
				buffer[0] = mode->palette[index * 4 + 0];
				buffer[1] = mode->palette[index * 4 + 1];
				buffer[2] = mode->palette[index * 4 + 2];
				if (has_alpha) buffer[3] = mode->palette[index * 4 + 3];
			}
		}
	}
	else if (mode->colortype == LCT_GREY_ALPHA)
	{
		if (mode->bitdepth == 8)
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = buffer[1] = buffer[2] = in[i * 2 + 0];
				if (has_alpha) buffer[3] = in[i * 2 + 1];
			}
		}
		else
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = buffer[1] = buffer[2] = in[i * 4 + 0];
				if (has_alpha) buffer[3] = in[i * 4 + 2];
			}
		}
	}
	else if (mode->colortype == LCT_RGBA)
	{
		if (mode->bitdepth == 8)
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = in[i * 4 + 0];
				buffer[1] = in[i * 4 + 1];
				buffer[2] = in[i * 4 + 2];
				if (has_alpha) buffer[3] = in[i * 4 + 3];
			}
		}
		else
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = in[i * 8 + 0];
				buffer[1] = in[i * 8 + 2];
				buffer[2] = in[i * 8 + 4];
				if (has_alpha) buffer[3] = in[i * 8 + 6];
			}
		}
	}
}